

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  char *__s;
  size_t sVar3;
  uint64_t uVar4;
  long in_RSI;
  int in_EDI;
  uchar rand32 [32];
  char *env;
  undefined4 in_stack_00000044;
  int in_stack_00000094;
  int in_stack_000001b4;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  secp256k1_context *ctx;
  uint in_stack_ffffffffffffffcc;
  int local_4;
  
  setbuf(_stdout,(char *)0x0);
  setbuf(_stderr,(char *)0x0);
  if (in_EDI < 2) {
    __s = getenv("SECP256K1_TEST_ITERS");
    if ((__s != (char *)0x0) && (sVar3 = strlen(__s), sVar3 != 0)) {
      lVar2 = strtol(__s,(char **)0x0,0);
      COUNT = (int)lVar2;
    }
  }
  else {
    lVar2 = strtol(*(char **)(in_RSI + 8),(char **)0x0,0);
    COUNT = (int)lVar2;
  }
  if (COUNT < 1) {
    fputs("An iteration count of 0 or less is not allowed.\n",_stderr);
    local_4 = 1;
  }
  else {
    printf("test count = %i\n",(ulong)(uint)COUNT);
    run_xoshiro256pp_tests();
    if (in_EDI < 3) {
      ctx = (secp256k1_context *)0x0;
    }
    else {
      ctx = *(secp256k1_context **)(in_RSI + 0x10);
    }
    testrand_init((char *)CONCAT44(in_stack_00000044,argc));
    CTX = secp256k1_context_create(in_stack_ffffffffffffffcc);
    uVar4 = testrand_bits(in_stack_ffffffffffffffbc);
    if (uVar4 != 0) {
      testrand256((uchar *)ctx);
      iVar1 = secp256k1_context_randomize
                        ((secp256k1_context *)
                         CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                         (uchar *)0x10dfba);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/tests.c"
                ,0x1e1a,"test condition failed: secp256k1_context_randomize(CTX, rand32)");
        abort();
      }
    }
    STATIC_CTX = (secp256k1_context *)malloc(0xe8);
    if (STATIC_CTX == (secp256k1_context *)0x0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x1e21,"test condition failed: STATIC_CTX != NULL");
      abort();
    }
    memcpy(STATIC_CTX,secp256k1_context_static,0xe8);
    iVar1 = secp256k1_context_is_proper((secp256k1_context *)0x10e088);
    if (iVar1 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x1e23,"test condition failed: !secp256k1_context_is_proper(STATIC_CTX)");
      abort();
    }
    run_selftest_tests();
    run_proper_context_tests(in_stack_000001b4);
    run_proper_context_tests(in_stack_000001b4);
    run_static_context_tests(in_stack_00000094);
    run_static_context_tests(in_stack_00000094);
    run_deprecated_context_flags_test();
    run_scratch_tests();
    run_int128_tests();
    run_ctz_tests();
    run_modinv_tests();
    run_inverse_tests();
    run_hsort_tests();
    run_sha256_known_output_tests();
    run_sha256_counter_tests();
    run_hmac_sha256_tests();
    run_rfc6979_hmac_sha256_tests();
    run_tagged_sha256_tests();
    run_scalar_tests();
    run_field_half();
    run_field_misc();
    run_field_convert();
    run_field_be32_overflow();
    run_fe_mul();
    run_sqr();
    run_sqrt();
    run_ge();
    run_gej();
    run_group_decompress();
    run_ecmult_pre_g();
    run_wnaf();
    run_point_times_order();
    run_ecmult_near_split_bound();
    run_ecmult_chain();
    run_ecmult_constants();
    run_ecmult_gen_blind();
    run_ecmult_const_tests();
    run_ecmult_multi_tests();
    run_ec_combine();
    run_endomorphism_tests();
    run_ec_pubkey_parse_test();
    run_eckey_edge_case_test();
    run_eckey_negate_test();
    run_ec_illegal_argument_tests();
    run_pubkey_comparison();
    run_pubkey_sort();
    run_random_pubkeys();
    run_ecdsa_der_parse();
    run_ecdsa_sign_verify();
    run_ecdsa_end_to_end();
    run_ecdsa_edge_cases();
    run_ecdsa_wycheproof();
    run_recovery_tests();
    run_extrakeys_tests();
    run_schnorrsig_tests();
    run_ellswift_tests();
    run_secp256k1_memczero_test();
    run_secp256k1_is_zero_array_test();
    run_secp256k1_byteorder_tests();
    run_cmov_tests();
    free(STATIC_CTX);
    secp256k1_context_destroy(ctx);
    testrand_finish();
    printf("no problems found\n");
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int main(int argc, char **argv) {
    /* Disable buffering for stdout to improve reliability of getting
     * diagnostic information. Happens right at the start of main because
     * setbuf must be used before any other operation on the stream. */
    setbuf(stdout, NULL);
    /* Also disable buffering for stderr because it's not guaranteed that it's
     * unbuffered on all systems. */
    setbuf(stderr, NULL);

    /* find iteration count */
    if (argc > 1) {
        COUNT = strtol(argv[1], NULL, 0);
    } else {
        const char* env = getenv("SECP256K1_TEST_ITERS");
        if (env && strlen(env) > 0) {
            COUNT = strtol(env, NULL, 0);
        }
    }
    if (COUNT <= 0) {
        fputs("An iteration count of 0 or less is not allowed.\n", stderr);
        return EXIT_FAILURE;
    }
    printf("test count = %i\n", COUNT);

    /* run test RNG tests (must run before we really initialize the test RNG) */
    run_xoshiro256pp_tests();

    /* find random seed */
    testrand_init(argc > 2 ? argv[2] : NULL);

    /*** Setup test environment ***/

    /* Create a global context available to all tests */
    CTX = secp256k1_context_create(SECP256K1_CONTEXT_NONE);
    /* Randomize the context only with probability 15/16
       to make sure we test without context randomization from time to time.
       TODO Reconsider this when recalibrating the tests. */
    if (testrand_bits(4)) {
        unsigned char rand32[32];
        testrand256(rand32);
        CHECK(secp256k1_context_randomize(CTX, rand32));
    }
    /* Make a writable copy of secp256k1_context_static in order to test the effect of API functions
       that write to the context. The API does not support cloning the static context, so we use
       memcpy instead. The user is not supposed to copy a context but we should still ensure that
       the API functions handle copies of the static context gracefully. */
    STATIC_CTX = malloc(sizeof(*secp256k1_context_static));
    CHECK(STATIC_CTX != NULL);
    memcpy(STATIC_CTX, secp256k1_context_static, sizeof(secp256k1_context));
    CHECK(!secp256k1_context_is_proper(STATIC_CTX));

    /*** Run actual tests ***/

    /* selftest tests */
    run_selftest_tests();

    /* context tests */
    run_proper_context_tests(0); run_proper_context_tests(1);
    run_static_context_tests(0); run_static_context_tests(1);
    run_deprecated_context_flags_test();

    /* scratch tests */
    run_scratch_tests();

    /* integer arithmetic tests */
#ifdef SECP256K1_WIDEMUL_INT128
    run_int128_tests();
#endif
    run_ctz_tests();
    run_modinv_tests();
    run_inverse_tests();

    /* sorting tests */
    run_hsort_tests();

    /* hash tests */
    run_sha256_known_output_tests();
    run_sha256_counter_tests();
    run_hmac_sha256_tests();
    run_rfc6979_hmac_sha256_tests();
    run_tagged_sha256_tests();

    /* scalar tests */
    run_scalar_tests();

    /* field tests */
    run_field_half();
    run_field_misc();
    run_field_convert();
    run_field_be32_overflow();
    run_fe_mul();
    run_sqr();
    run_sqrt();

    /* group tests */
    run_ge();
    run_gej();
    run_group_decompress();

    /* ecmult tests */
    run_ecmult_pre_g();
    run_wnaf();
    run_point_times_order();
    run_ecmult_near_split_bound();
    run_ecmult_chain();
    run_ecmult_constants();
    run_ecmult_gen_blind();
    run_ecmult_const_tests();
    run_ecmult_multi_tests();
    run_ec_combine();

    /* endomorphism tests */
    run_endomorphism_tests();

    /* EC point parser test */
    run_ec_pubkey_parse_test();

    /* EC key edge cases */
    run_eckey_edge_case_test();

    /* EC key arithmetic test */
    run_eckey_negate_test();

#ifdef ENABLE_MODULE_ECDH
    /* ecdh tests */
    run_ecdh_tests();
#endif

    /* ecdsa tests */
    run_ec_illegal_argument_tests();
    run_pubkey_comparison();
    run_pubkey_sort();
    run_random_pubkeys();
    run_ecdsa_der_parse();
    run_ecdsa_sign_verify();
    run_ecdsa_end_to_end();
    run_ecdsa_edge_cases();
    run_ecdsa_wycheproof();

#ifdef ENABLE_MODULE_RECOVERY
    /* ECDSA pubkey recovery tests */
    run_recovery_tests();
#endif

#ifdef ENABLE_MODULE_EXTRAKEYS
    run_extrakeys_tests();
#endif

#ifdef ENABLE_MODULE_SCHNORRSIG
    run_schnorrsig_tests();
#endif

#ifdef ENABLE_MODULE_MUSIG
    run_musig_tests();
#endif

#ifdef ENABLE_MODULE_ELLSWIFT
    run_ellswift_tests();
#endif

    /* util tests */
    run_secp256k1_memczero_test();
    run_secp256k1_is_zero_array_test();
    run_secp256k1_byteorder_tests();

    run_cmov_tests();

    /*** Tear down test environment ***/
    free(STATIC_CTX);
    secp256k1_context_destroy(CTX);

    testrand_finish();

    printf("no problems found\n");
    return 0;
}